

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall
tlx::CmdlineParser::ArgumentBytes32::process(ArgumentBytes32 *this,int *argc,char ***argv)

{
  bool bVar1;
  ulong local_30;
  uint64_t dest;
  char ***argv_local;
  int *argc_local;
  ArgumentBytes32 *this_local;
  
  if (*argc == 0) {
    this_local._7_1_ = false;
  }
  else {
    dest = (uint64_t)argv;
    argv_local = (char ***)argc;
    argc_local = (int *)this;
    bVar1 = parse_si_iec_units(**argv,&local_30,'\0');
    if ((bVar1) && (*this->dest_ = (uint32_t)local_30, (local_30 & 0xffffffff) == local_30)) {
      *(int *)argv_local = *(int *)argv_local + -1;
      *(long *)dest = *(long *)dest + 8;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        uint64_t dest;
        if (parse_si_iec_units(argv[0], &dest) &&
            static_cast<uint64_t>(
                dest_ = static_cast<uint32_t>(dest)) == dest) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }